

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

void * __thiscall
embree::Geometry::getBufferData
          (Geometry *this,RTCBufferType type,uint slot,BufferDataPointerType pointerType)

{
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38 [32];
  
  puVar1 = (undefined8 *)
           __cxa_allocate_exception
                     (0x30,CONCAT44(in_register_00000034,type),CONCAT44(in_register_00000014,slot));
  std::__cxx11::string::string(local_38,"operation not supported for this geometry",&local_39);
  *puVar1 = &PTR__rtcore_error_002496e8;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual void* getBufferData(RTCBufferType type, unsigned int slot, BufferDataPointerType pointerType) {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"operation not supported for this geometry");
    }